

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int test_signed<int>(char *Name)

{
  int iVar1;
  ostream *poVar2;
  uint8_t local_28 [4];
  uint8_t local_24 [4];
  int tmp2;
  uint8_t tmp [4];
  uint8_t cst_minus10_be [4];
  uint8_t cst_minus10_le [4];
  char *Name_local;
  
  memset(tmp,0xff,4);
  memset(&tmp2,0xff,4);
  tmp[0] = 0xf6;
  tmp2 = CONCAT13(0xf6,(undefined3)tmp2);
  iVar1 = intmem::loadu_le<int>(tmp);
  if (iVar1 == -10) {
    iVar1 = intmem::loadu_be<int>((uint8_t *)&tmp2);
    if (iVar1 == -10) {
      iVar1 = intmem::load_le<int>((int *)tmp);
      if (iVar1 == -10) {
        iVar1 = intmem::load_be<int>(&tmp2);
        if (iVar1 == -10) {
          intmem::storeu_le<int>(local_24,-10);
          if (local_24 == tmp) {
            intmem::storeu_be<int>(local_24,-10);
            if (local_24 == (uint8_t  [4])tmp2) {
              intmem::store_le<int>((int *)local_28,-10);
              if (local_28 == tmp) {
                intmem::storeu_be<int>(local_28,-10);
                if (local_28 == (uint8_t  [4])tmp2) {
                  Name_local._4_4_ = 0;
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cerr,Name);
                  poVar2 = std::operator<<(poVar2,": error storing BE integer!");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  Name_local._4_4_ = 1;
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cerr,Name);
                poVar2 = std::operator<<(poVar2,": error storing LE integer!");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                Name_local._4_4_ = 1;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cerr,Name);
              poVar2 = std::operator<<(poVar2,": error storing BE integer!");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              Name_local._4_4_ = 1;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cerr,Name);
            poVar2 = std::operator<<(poVar2,": error storing LE integer!");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            Name_local._4_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,Name);
          poVar2 = std::operator<<(poVar2,": error loading BE signed integer!");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          Name_local._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,Name);
        poVar2 = std::operator<<(poVar2,": error loading LE signed integer!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Name_local._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,Name);
      poVar2 = std::operator<<(poVar2,": error loading BE signed integer!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Name_local._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,Name);
    poVar2 = std::operator<<(poVar2,": error loading LE signed integer!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Name_local._4_4_ = 1;
  }
  return Name_local._4_4_;
}

Assistant:

int test_signed(const char* Name)
{
  ALIGN(alignof(T)) uint8_t cst_minus10_le[sizeof(T)];
  ALIGN(alignof(T)) uint8_t cst_minus10_be[sizeof(T)];
  memset(&cst_minus10_le[0], 0xFF, sizeof(T));
  memset(&cst_minus10_be[0], 0xFF, sizeof(T));
  cst_minus10_le[0] = 0xF6;
  cst_minus10_be[sizeof(T)-1] = 0xF6;
  if (loadu_le<T>(cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (loadu_be<T>(cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }
  if (load_le<T>((T*) cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (load_be<T>((T*) cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }

  uint8_t tmp[sizeof(T)];
  storeu_le<T>(tmp, -10);
  if (memcmp(tmp, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>((T*) tmp, -10);
  if (memcmp(tmp, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }

  T tmp2;
  store_le<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }
  return 0;
}